

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *other,AffineSpace3fa *space,
          string *id)

{
  pointer pRVar1;
  long *plVar2;
  PerspectiveCameraNode *this_00;
  long lVar3;
  allocator local_91;
  AnimatedPerspectiveCameraNode *local_90;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *local_88;
  AffineSpace3fa *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_80 = space;
  std::__cxx11::string::string((string *)&local_70,(string *)id);
  PerspectiveCameraNode::PerspectiveCameraNode(&this->super_PerspectiveCameraNode,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedPerspectiveCameraNode_002aa3f8;
  this->time_range = other->ptr->time_range;
  local_88 = &this->cameras;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = this;
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::resize(local_88,(long)(other->ptr->cameras).
                          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(other->ptr->cameras).
                          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar3 = 0;
  for (local_78 = 0;
      local_78 <
      (ulong)((long)(other->ptr->cameras).
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(other->ptr->cameras).
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3); local_78 = local_78 + 1) {
    this_00 = (PerspectiveCameraNode *)PerspectiveCameraNode::operator_new(0xb0);
    pRVar1 = (other->ptr->cameras).
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_50,"",&local_91);
    PerspectiveCameraNode::PerspectiveCameraNode
              (this_00,(Ref<embree::SceneGraph::PerspectiveCameraNode> *)
                       ((long)&pRVar1->ptr + lVar3),local_80,&local_50);
    pRVar1 = (local_88->
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    plVar2 = *(long **)((long)&pRVar1->ptr + lVar3);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x18))();
    }
    *(PerspectiveCameraNode **)((long)&pRVar1->ptr + lVar3) = this_00;
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (const Ref<AnimatedPerspectiveCameraNode>& other, const AffineSpace3fa& space, const std::string& id)
        : PerspectiveCameraNode(id), time_range(other->time_range)
      {
        cameras.resize(other->size());
        for (size_t i=0; i<other->size(); i++)
          cameras[i] = new PerspectiveCameraNode(other->cameras[i],space);
      }